

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O1

FieldGeneratorBase *
google::protobuf::compiler::csharp::CreateFieldGenerator
          (FieldDescriptor *descriptor,int presenceIndex,Options *options)

{
  FieldDescriptor FVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  FieldGeneratorBase *pFVar5;
  PrimitiveFieldGenerator *this;
  WrapperFieldGenerator *this_00;
  string *psVar6;
  bool bVar7;
  csharp local_30 [16];
  
  if ((byte)descriptor[2] - 10 < 2) {
    FVar1 = descriptor[1];
    bVar7 = (bool)(((byte)FVar1 & 0x20) >> 5);
    if (0xbf < (byte)FVar1 == bVar7) {
      psVar6 = (string *)0x0;
    }
    else {
      psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (bVar7,0xbf < (byte)FVar1,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar6 == (string *)0x0) {
      if (((byte)descriptor[1] & 0x20) != 0) {
        if ((descriptor[2] == (FieldDescriptor)0xb) &&
           (cVar2 = google::protobuf::FieldDescriptor::is_map_message_type(), cVar2 != '\0')) {
          pFVar5 = (FieldGeneratorBase *)operator_new(0x40);
          MapFieldGenerator::MapFieldGenerator
                    ((MapFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
          return pFVar5;
        }
        pFVar5 = (FieldGeneratorBase *)operator_new(0x40);
        RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                  ((RepeatedMessageFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
        return pFVar5;
      }
      if (descriptor[2] == (FieldDescriptor)0xb) {
        lVar4 = google::protobuf::FieldDescriptor::message_type();
        iVar3 = std::__cxx11::string::compare(*(char **)(*(long *)(lVar4 + 0x10) + 8));
        if (iVar3 != 0) goto LAB_002400da;
        if (-1 < (char)descriptor[3]) {
LAB_002403cb:
          this_00 = (WrapperFieldGenerator *)operator_new(0x48);
          WrapperFieldGenerator::WrapperFieldGenerator(this_00,descriptor,presenceIndex,options);
          return &this_00->super_FieldGeneratorBase;
        }
        if (((byte)descriptor[1] & 0x10) == 0) {
          lVar4 = 0;
        }
        else {
          lVar4 = *(long *)(descriptor + 0x28);
          if (lVar4 == 0) goto LAB_002404d0;
        }
        if (lVar4 == 0) goto LAB_002404b8;
        if ((*(int *)(lVar4 + 4) != 1) || ((*(byte *)(*(long *)(lVar4 + 0x30) + 1) & 2) == 0)) {
          if ((char)descriptor[3] < '\0') {
            pFVar5 = (FieldGeneratorBase *)operator_new(0x48);
            WrapperOneofFieldGenerator::WrapperOneofFieldGenerator
                      ((WrapperOneofFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
            return pFVar5;
          }
          goto LAB_002403cb;
        }
      }
      else {
LAB_002400da:
        if (-1 < (char)descriptor[3]) {
LAB_0024027b:
          pFVar5 = (FieldGeneratorBase *)operator_new(0x40);
          MessageFieldGenerator::MessageFieldGenerator
                    ((MessageFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
          return pFVar5;
        }
        if (((byte)descriptor[1] & 0x10) == 0) {
          lVar4 = 0;
        }
        else {
          lVar4 = *(long *)(descriptor + 0x28);
          if (lVar4 == 0) {
LAB_002404d0:
            google::protobuf::internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xa9a);
          }
        }
        if (lVar4 == 0) goto LAB_002404b8;
        if ((*(int *)(lVar4 + 4) != 1) || ((*(byte *)(*(long *)(lVar4 + 0x30) + 1) & 2) == 0)) {
          if ((char)descriptor[3] < '\0') {
            pFVar5 = (FieldGeneratorBase *)operator_new(0x40);
            MessageOneofFieldGenerator::MessageOneofFieldGenerator
                      ((MessageOneofFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
            return pFVar5;
          }
          goto LAB_0024027b;
        }
        CreateFieldGenerator(local_30);
LAB_00240473:
        CreateFieldGenerator(local_30);
LAB_0024047d:
        CreateFieldGenerator(local_30);
      }
      CreateFieldGenerator(local_30);
    }
    CreateFieldGenerator();
LAB_0024049e:
    CreateFieldGenerator();
  }
  else {
    if (descriptor[2] == (FieldDescriptor)0xe) {
      FVar1 = descriptor[1];
      bVar7 = (bool)(((byte)FVar1 & 0x20) >> 5);
      if (0xbf < (byte)FVar1 == bVar7) {
        psVar6 = (string *)0x0;
      }
      else {
        psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                           (bVar7,0xbf < (byte)FVar1,"is_repeated_ == label() == LABEL_REPEATED");
      }
      if (psVar6 == (string *)0x0) {
        if (((byte)descriptor[1] & 0x20) != 0) {
          pFVar5 = (FieldGeneratorBase *)operator_new(0x40);
          RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                    ((RepeatedEnumFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
          return pFVar5;
        }
        if (-1 < (char)descriptor[3]) {
LAB_002402ed:
          pFVar5 = (FieldGeneratorBase *)operator_new(0x48);
          EnumFieldGenerator::EnumFieldGenerator
                    ((EnumFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
          return pFVar5;
        }
        if (((byte)descriptor[1] & 0x10) == 0) {
          lVar4 = 0;
        }
        else {
          lVar4 = *(long *)(descriptor + 0x28);
          if (lVar4 == 0) goto LAB_002404d0;
        }
        if (lVar4 == 0) goto LAB_002404b8;
        if ((*(int *)(lVar4 + 4) != 1) || ((*(byte *)(*(long *)(lVar4 + 0x30) + 1) & 2) == 0)) {
          if ((char)descriptor[3] < '\0') {
            pFVar5 = (FieldGeneratorBase *)operator_new(0x48);
            EnumOneofFieldGenerator::EnumOneofFieldGenerator
                      ((EnumOneofFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
            return pFVar5;
          }
          goto LAB_002402ed;
        }
        goto LAB_00240473;
      }
      goto LAB_0024049e;
    }
    FVar1 = descriptor[1];
    bVar7 = (bool)(((byte)FVar1 & 0x20) >> 5);
    if (0xbf < (byte)FVar1 == bVar7) {
      psVar6 = (string *)0x0;
    }
    else {
      psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (bVar7,0xbf < (byte)FVar1,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar6 == (string *)0x0) {
      if (((byte)descriptor[1] & 0x20) != 0) {
        pFVar5 = (FieldGeneratorBase *)operator_new(0x40);
        RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
                  ((RepeatedPrimitiveFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
        return pFVar5;
      }
      if (-1 < (char)descriptor[3]) {
LAB_0024033d:
        this = (PrimitiveFieldGenerator *)operator_new(0x48);
        PrimitiveFieldGenerator::PrimitiveFieldGenerator(this,descriptor,presenceIndex,options);
        return &this->super_FieldGeneratorBase;
      }
      if (((byte)descriptor[1] & 0x10) == 0) {
        lVar4 = 0;
      }
      else {
        lVar4 = *(long *)(descriptor + 0x28);
        if (lVar4 == 0) goto LAB_002404d0;
      }
      if (lVar4 == 0) goto LAB_002404b8;
      if ((*(int *)(lVar4 + 4) != 1) || ((*(byte *)(*(long *)(lVar4 + 0x30) + 1) & 2) == 0)) {
        if ((char)descriptor[3] < '\0') {
          pFVar5 = (FieldGeneratorBase *)operator_new(0x48);
          PrimitiveOneofFieldGenerator::PrimitiveOneofFieldGenerator
                    ((PrimitiveOneofFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
          return pFVar5;
        }
        goto LAB_0024033d;
      }
      goto LAB_0024047d;
    }
  }
  CreateFieldGenerator();
LAB_002404b8:
  google::protobuf::internal::protobuf_assumption_failed
            ("res != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
             ,0xac6);
}

Assistant:

FieldGeneratorBase* CreateFieldGenerator(const FieldDescriptor* descriptor,
                                         int presenceIndex,
                                         const Options* options) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
      if (descriptor->is_repeated()) {
        if (descriptor->is_map()) {
          return new MapFieldGenerator(descriptor, presenceIndex, options);
        } else {
          return new RepeatedMessageFieldGenerator(descriptor, presenceIndex,
                                                   options);
        }
      } else {
        if (IsWrapperType(descriptor)) {
          if (descriptor->real_containing_oneof()) {
            return new WrapperOneofFieldGenerator(descriptor, presenceIndex,
                                                  options);
          } else {
            return new WrapperFieldGenerator(descriptor, presenceIndex,
                                             options);
          }
        } else {
          if (descriptor->real_containing_oneof()) {
            return new MessageOneofFieldGenerator(descriptor, presenceIndex,
                                                  options);
          } else {
            return new MessageFieldGenerator(descriptor, presenceIndex,
                                             options);
          }
        }
      }
    case FieldDescriptor::TYPE_ENUM:
      if (descriptor->is_repeated()) {
        return new RepeatedEnumFieldGenerator(descriptor, presenceIndex,
                                              options);
      } else {
        if (descriptor->real_containing_oneof()) {
          return new EnumOneofFieldGenerator(descriptor, presenceIndex,
                                             options);
        } else {
          return new EnumFieldGenerator(descriptor, presenceIndex, options);
        }
      }
    default:
      if (descriptor->is_repeated()) {
        return new RepeatedPrimitiveFieldGenerator(descriptor, presenceIndex,
                                                   options);
      } else {
        if (descriptor->real_containing_oneof()) {
          return new PrimitiveOneofFieldGenerator(descriptor, presenceIndex,
                                                  options);
        } else {
          return new PrimitiveFieldGenerator(descriptor, presenceIndex,
                                             options);
        }
      }
  }
}